

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void init_rx(ixgbe_device *dev)

{
  uint8_t *addr;
  uint32_t uVar1;
  undefined8 *puVar2;
  long in_RDI;
  dma_memory dVar3;
  uint16_t i_2;
  ixgbe_rx_queue *queue;
  dma_memory mem;
  uint32_t ring_size_bytes;
  uint16_t i_1;
  int i;
  undefined1 in_stack_000019ff;
  size_t in_stack_00001a00;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int local_ac;
  int local_9c;
  int local_8c;
  int local_7c;
  int local_5c;
  int local_58;
  int local_48;
  int local_44;
  ushort local_32;
  void *local_28;
  uintptr_t local_20;
  ushort local_e;
  int local_c;
  
  clear_flags32((uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(uint32_t)in_stack_ffffffffffffff38)
  ;
  set_reg32(*(uint8_t **)(in_RDI + 0x70),0x3c00,0x20000);
  for (local_c = 1; local_c < 8; local_c = local_c + 1) {
    set_reg32(*(uint8_t **)(in_RDI + 0x70),local_c * 4 + 0x3c00,0);
  }
  set_flags32((uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(uint32_t)in_stack_ffffffffffffff38);
  set_flags32((uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(uint32_t)in_stack_ffffffffffffff38);
  set_flags32((uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(uint32_t)in_stack_ffffffffffffff38);
  for (local_e = 0; local_e < *(ushort *)(in_RDI + 0x10); local_e = local_e + 1) {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): initializing rx queue %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x15a,"init_rx",(ulong)local_e);
    addr = *(uint8_t **)(in_RDI + 0x70);
    if (local_e < 0x10) {
      local_44 = (uint)local_e * 4 + 0x2100;
    }
    else {
      if (local_e < 0x40) {
        local_48 = (uint)local_e * 0x40 + 0x1014;
      }
      else {
        local_48 = (local_e - 0x40) * 0x40 + 0xd014;
      }
      local_44 = local_48;
    }
    if (local_e < 0x10) {
      local_58 = (uint)local_e * 4 + 0x2100;
    }
    else {
      if (local_e < 0x40) {
        local_5c = (uint)local_e * 0x40 + 0x1014;
      }
      else {
        local_5c = (local_e - 0x40) * 0x40 + 0xd014;
      }
      local_58 = local_5c;
    }
    uVar1 = get_reg32(*(uint8_t **)(in_RDI + 0x70),local_58);
    set_reg32(addr,local_44,uVar1 & 0xf1ffffff | 0x2000000);
    set_flags32((uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(uint32_t)in_stack_ffffffffffffff38)
    ;
    dVar3 = memory_allocate_dma(in_stack_00001a00,(_Bool)in_stack_000019ff);
    local_28 = dVar3.virt;
    memset(local_28,0xff,0x2000);
    if (local_e < 0x40) {
      local_7c = (uint)local_e * 0x40 + 0x1000;
    }
    else {
      local_7c = (local_e - 0x40) * 0x40 + 0xd000;
    }
    local_20 = dVar3.phy;
    set_reg32(*(uint8_t **)(in_RDI + 0x70),local_7c,(uint32_t)dVar3.phy);
    if (local_e < 0x40) {
      local_8c = (uint)local_e * 0x40 + 0x1004;
    }
    else {
      local_8c = (local_e - 0x40) * 0x40 + 0xd004;
    }
    set_reg32(*(uint8_t **)(in_RDI + 0x70),local_8c,dVar3.phy._4_4_);
    if (local_e < 0x40) {
      local_9c = (uint)local_e * 0x40 + 0x1008;
    }
    else {
      local_9c = (local_e - 0x40) * 0x40 + 0xd008;
    }
    set_reg32(*(uint8_t **)(in_RDI + 0x70),local_9c,0x2000);
    fprintf(_stderr,"[DEBUG] %s:%d %s(): rx ring %d phy addr:  0x%012lX\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x169,"init_rx",(ulong)local_e,local_20);
    fprintf(_stderr,"[DEBUG] %s:%d %s(): rx ring %d virt addr: 0x%012lX\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x16a,"init_rx",(ulong)local_e,local_28);
    if (local_e < 0x40) {
      local_ac = (uint)local_e * 0x40 + 0x1010;
    }
    else {
      local_ac = (local_e - 0x40) * 0x40 + 0xd010;
    }
    set_reg32(*(uint8_t **)(in_RDI + 0x70),local_ac,0);
    if (local_e < 0x40) {
      in_stack_ffffffffffffff44 = (uint)local_e * 0x40 + 0x1018;
    }
    else {
      in_stack_ffffffffffffff44 = (local_e - 0x40) * 0x40 + 0xd018;
    }
    set_reg32(*(uint8_t **)(in_RDI + 0x70),in_stack_ffffffffffffff44,0);
    puVar2 = (undefined8 *)(*(long *)(in_RDI + 0x78) + (long)(int)(uint)local_e * 0x18);
    *(undefined2 *)(puVar2 + 2) = 0x200;
    *(undefined2 *)((long)puVar2 + 0x12) = 0;
    *puVar2 = local_28;
  }
  set_flags32((uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(uint32_t)in_stack_ffffffffffffff38);
  for (local_32 = 0; local_32 < *(ushort *)(in_RDI + 0x10); local_32 = local_32 + 1) {
    in_stack_ffffffffffffff38 = *(undefined8 *)(in_RDI + 0x70);
    clear_flags32((uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                  (uint32_t)in_stack_ffffffffffffff38);
  }
  set_flags32((uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(uint32_t)in_stack_ffffffffffffff38);
  return;
}

Assistant:

static void init_rx(struct ixgbe_device* dev) {
	// make sure that rx is disabled while re-configuring it
	// the datasheet also wants us to disable some crypto-offloading related rx paths (but we don't care about them)
	clear_flags32(dev->addr, IXGBE_RXCTRL, IXGBE_RXCTRL_RXEN);
	// no fancy dcb or vt, just a single 128kb packet buffer for us
	set_reg32(dev->addr, IXGBE_RXPBSIZE(0), IXGBE_RXPBSIZE_128KB);
	for (int i = 1; i < 8; i++) {
		set_reg32(dev->addr, IXGBE_RXPBSIZE(i), 0);
	}

	// always enable CRC offloading
	set_flags32(dev->addr, IXGBE_HLREG0, IXGBE_HLREG0_RXCRCSTRP);
	set_flags32(dev->addr, IXGBE_RDRXCTL, IXGBE_RDRXCTL_CRCSTRIP);

	// accept broadcast packets
	set_flags32(dev->addr, IXGBE_FCTRL, IXGBE_FCTRL_BAM);

	// per-queue config, same for all queues
	for (uint16_t i = 0; i < dev->ixy.num_rx_queues; i++) {
		debug("initializing rx queue %d", i);
		// enable advanced rx descriptors, we could also get away with legacy descriptors, but they aren't really easier
		set_reg32(dev->addr, IXGBE_SRRCTL(i), (get_reg32(dev->addr, IXGBE_SRRCTL(i)) & ~IXGBE_SRRCTL_DESCTYPE_MASK) | IXGBE_SRRCTL_DESCTYPE_ADV_ONEBUF);
		// drop_en causes the nic to drop packets if no rx descriptors are available instead of buffering them
		// a single overflowing queue can fill up the whole buffer and impact operations if not setting this flag
		set_flags32(dev->addr, IXGBE_SRRCTL(i), IXGBE_SRRCTL_DROP_EN);
		// setup descriptor ring, see section 7.1.9
		uint32_t ring_size_bytes = NUM_RX_QUEUE_ENTRIES * sizeof(union ixgbe_adv_rx_desc);
		struct dma_memory mem = memory_allocate_dma(ring_size_bytes, true);
		// neat trick from Snabb: initialize to 0xFF to prevent rogue memory accesses on premature DMA activation
		memset(mem.virt, -1, ring_size_bytes);
		// tell the device where it can write to (its iova, so its view)
		set_reg32(dev->addr, IXGBE_RDBAL(i), (uint32_t) (mem.phy & 0xFFFFFFFFull));
		set_reg32(dev->addr, IXGBE_RDBAH(i), (uint32_t) (mem.phy >> 32));
		set_reg32(dev->addr, IXGBE_RDLEN(i), ring_size_bytes);
		debug("rx ring %d phy addr:  0x%012lX", i, mem.phy);
		debug("rx ring %d virt addr: 0x%012lX", i, (uintptr_t) mem.virt);
		// set ring to empty at start
		set_reg32(dev->addr, IXGBE_RDH(i), 0);
		set_reg32(dev->addr, IXGBE_RDT(i), 0);
		// private data for the driver, 0-initialized
		struct ixgbe_rx_queue* queue = ((struct ixgbe_rx_queue*)(dev->rx_queues)) + i;
		queue->num_entries = NUM_RX_QUEUE_ENTRIES;
		queue->rx_index = 0;
		queue->descriptors = (union ixgbe_adv_rx_desc*) mem.virt;
	}

	// last step is to set some magic bits mentioned in the last sentence in 4.6.7
	set_flags32(dev->addr, IXGBE_CTRL_EXT, IXGBE_CTRL_EXT_NS_DIS);
	// this flag probably refers to a broken feature: it's reserved and initialized as '1' but it must be set to '0'
	// there isn't even a constant in ixgbe_types.h for this flag
	for (uint16_t i = 0; i < dev->ixy.num_rx_queues; i++) {
		clear_flags32(dev->addr, IXGBE_DCA_RXCTRL(i), 1 << 12);
	}

	// start RX
	set_flags32(dev->addr, IXGBE_RXCTRL, IXGBE_RXCTRL_RXEN);
}